

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement_verifier.cpp
# Opt level: O2

string * __thiscall
duckdb::StatementVerifier::CompareResults_abi_cxx11_
          (string *__return_storage_ptr__,StatementVerifier *this,StatementVerifier *other)

{
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *this_00;
  bool bVar1;
  bool bVar2;
  pointer pMVar3;
  ColumnDataCollection *left;
  ColumnDataCollection *right;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  *this_02;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_02 = &this->materialized_result;
  pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(this_02);
  bVar1 = BaseQueryResult::HasError((BaseQueryResult *)pMVar3);
  this_00 = &other->materialized_result;
  pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->(this_00);
  bVar2 = BaseQueryResult::HasError((BaseQueryResult *)pMVar3);
  if (bVar1 == bVar2) {
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_02);
    bVar1 = BaseQueryResult::HasError((BaseQueryResult *)pMVar3);
    if (bVar1) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_b0)
      ;
      goto LAB_01af2f25;
    }
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_02);
    left = MaterializedQueryResult::Collection(pMVar3);
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    right = MaterializedQueryResult::Collection(pMVar3);
    bVar1 = ColumnDataCollection::ResultEquals(left,right,&local_50,false);
    if (bVar1) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_b0)
      ;
      goto LAB_01af2f25;
    }
    ::std::operator+(__return_storage_ptr__,&other->name,
                     " statement differs from original result!\n");
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_02);
    (*(pMVar3->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_90,pMVar3);
    ::std::operator+(&local_b0,"Original Result:\n",&local_90);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::operator+(&local_90,&other->name,":\n");
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    (*(pMVar3->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_70,pMVar3);
    ::std::operator+(&local_b0,&local_90,&local_70);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::operator+(&local_b0,"\n\n---------------------------------\n",&local_50);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    this_01 = &local_b0;
  }
  else {
    ::std::operator+(__return_storage_ptr__,&other->name,
                     " statement differs from original result!\n");
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_02);
    (*(pMVar3->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_90,pMVar3);
    ::std::operator+(&local_b0,"Original Result:\n",&local_90);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::operator+(&local_90,&other->name,":\n");
    pMVar3 = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->(this_00);
    (*(pMVar3->super_QueryResult).super_BaseQueryResult._vptr_BaseQueryResult[4])(&local_70,pMVar3);
    ::std::operator+(&local_b0,&local_90,&local_70);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_70);
    this_01 = &local_90;
  }
  ::std::__cxx11::string::~string((string *)this_01);
LAB_01af2f25:
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

string StatementVerifier::CompareResults(const StatementVerifier &other) {
	D_ASSERT(type == VerificationType::ORIGINAL);
	string error;
	if (materialized_result->HasError() != other.materialized_result->HasError()) { // LCOV_EXCL_START
		string result = other.name + " statement differs from original result!\n";
		result += "Original Result:\n" + materialized_result->ToString();
		result += other.name + ":\n" + other.materialized_result->ToString();
		return result;
	} // LCOV_EXCL_STOP
	if (materialized_result->HasError()) {
		return "";
	}
	if (!ColumnDataCollection::ResultEquals(materialized_result->Collection(), other.materialized_result->Collection(),
	                                        error)) { // LCOV_EXCL_START
		string result = other.name + " statement differs from original result!\n";
		result += "Original Result:\n" + materialized_result->ToString();
		result += other.name + ":\n" + other.materialized_result->ToString();
		result += "\n\n---------------------------------\n" + error;
		return result;
	} // LCOV_EXCL_STOP

	return "";
}